

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test::
TestBody(GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test *this)

{
  Descriptor *this_00;
  ThreadSafeArena *pTVar1;
  Reflection *message_00;
  char *pcVar2;
  string_view src;
  string_view name;
  string_view value;
  string_view name_00;
  string_view value_00;
  string_view name_01;
  Metadata MVar3;
  AssertionResult gtest_ar;
  TestOneof2 message;
  anon_union_16_2_39e9c77e_for_Rep_0 local_80;
  AssertHelper local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined1 local_58 [64];
  
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_58,(Arena *)0x0);
  MVar3 = proto2_unittest::TestOneof2::GetMetadata
                    ((TestOneof2 *)proto2_unittest::_TestOneof2_default_instance_);
  this_00 = MVar3.descriptor;
  MVar3 = proto2_unittest::TestOneof2::GetMetadata
                    ((TestOneof2 *)proto2_unittest::_TestOneof2_default_instance_);
  message_00 = MVar3.reflection;
  if (local_58._56_4_ != 0x1e) {
    proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_58);
    local_58._56_4_ = 0x1e;
    local_58._40_8_ = operator_new(0x10);
    (((InlineData *)&(((Message *)local_58._40_8_)->super_MessageLite)._vptr_MessageLite)->rep_).
    field_0.as_tree.cordz_info = 0;
    (((Message *)local_58._40_8_)->super_MessageLite)._internal_metadata_.ptr_ = 0;
    pTVar1 = (ThreadSafeArena *)local_58._8_8_;
    if ((local_58._8_8_ & 1) != 0) {
      pTVar1 = *(ThreadSafeArena **)(local_58._8_8_ & 0xfffffffffffffffe);
    }
    if (pTVar1 != (ThreadSafeArena *)0x0) {
      protobuf::internal::ThreadSafeArena::AddCleanup
                (pTVar1,(void *)local_58._40_8_,
                 protobuf::internal::arena_delete_object<absl::lts_20250127::Cord>);
    }
  }
  src._M_str = "bytes_cord";
  src._M_len = 10;
  absl::lts_20250127::Cord::operator=((Cord *)local_58._40_8_,src);
  name._M_str = "foo_bytes_cord";
  name._M_len = 0xe;
  Descriptor::FindFieldByName(this_00,name);
  Reflection::GetCord((Reflection *)&local_80.as_tree,(Message *)message_00,
                      (FieldDescriptor *)local_58);
  testing::internal::CmpHelperEQ<char[11],absl::lts_20250127::Cord>
            (local_68,"\"bytes_cord\"",
             "reflection->GetCord(message, descriptor->FindFieldByName(\"foo_bytes_cord\"))",
             (char (*) [11])0x112f0a2,(Cord *)&local_80.as_tree);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_80.as_tree);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80.as_tree);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x621,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80.as_tree);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_80.as_tree.cordz_info != (long *)0x0) {
      (**(code **)(*(long *)local_80.as_tree.cordz_info + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  if (local_58._56_4_ != 2) {
    proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_58);
    local_58._56_4_ = 2;
    local_58._40_8_ = &protobuf::internal::fixed_address_empty_string;
  }
  pTVar1 = (ThreadSafeArena *)local_58._8_8_;
  if ((local_58._8_8_ & 1) != 0) {
    pTVar1 = *(ThreadSafeArena **)(local_58._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(local_58 + 0x28),value,(Arena *)pTVar1)
  ;
  name_00._M_str = "foo_string";
  name_00._M_len = 10;
  Descriptor::FindFieldByName(this_00,name_00);
  Reflection::GetCord((Reflection *)&local_80.as_tree,(Message *)message_00,
                      (FieldDescriptor *)local_58);
  testing::internal::CmpHelperEQ<char[4],absl::lts_20250127::Cord>
            (local_68,"\"foo\"",
             "reflection->GetCord( message, descriptor->FindFieldByName(\"foo_string\"))",
             (char (*) [4])0x11364a4,(Cord *)&local_80.as_tree);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_80.as_tree);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80.as_tree);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x625,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80.as_tree);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_80.as_tree.cordz_info != (long *)0x0) {
      (**(code **)(*(long *)local_80.as_tree.cordz_info + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  if (local_58._56_4_ != 5) {
    proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_58);
    local_58._56_4_ = 5;
    local_58._40_8_ = &protobuf::internal::fixed_address_empty_string;
  }
  if ((local_58._8_8_ & 1) != 0) {
    local_58._8_8_ = *(undefined8 *)(local_58._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "bytes";
  value_00._M_len = 5;
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_58 + 0x28),value_00,(Arena *)local_58._8_8_);
  name_01._M_str = "foo_bytes";
  name_01._M_len = 9;
  Descriptor::FindFieldByName(this_00,name_01);
  Reflection::GetCord((Reflection *)&local_80.as_tree,(Message *)message_00,
                      (FieldDescriptor *)local_58);
  testing::internal::CmpHelperEQ<char[6],absl::lts_20250127::Cord>
            (local_68,"\"bytes\"",
             "reflection->GetCord( message, descriptor->FindFieldByName(\"foo_bytes\"))",
             (char (*) [6])0x12af64c,(Cord *)&local_80.as_tree);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_80.as_tree);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80.as_tree);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x629,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80.as_tree);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_80.as_tree.cordz_info != (long *)0x0) {
      (**(code **)(*(long *)local_80.as_tree.cordz_info + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_58);
  return;
}

Assistant:

TEST_F(GeneratedMessageReflectionCordAccessorsTest, GetOneofCord) {
  unittest::TestOneof2 message;
  const Descriptor* descriptor = unittest::TestOneof2::descriptor();
  const Reflection* reflection = message.GetReflection();

  message.set_foo_bytes_cord("bytes_cord");
  EXPECT_EQ("bytes_cord",
            reflection->GetCord(message,
                                descriptor->FindFieldByName("foo_bytes_cord")));

  message.set_foo_string("foo");
  EXPECT_EQ("foo", reflection->GetCord(
                       message, descriptor->FindFieldByName("foo_string")));

  message.set_foo_bytes("bytes");
  EXPECT_EQ("bytes", reflection->GetCord(
                         message, descriptor->FindFieldByName("foo_bytes")));

}